

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

bool Js::RegexHelper::IsRegexSymbolMatchObservable
               (RecyclableObject *instance,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  DynamicObject *regexPrototype_00;
  undefined1 local_21;
  DynamicObject *regexPrototype;
  ScriptContext *scriptContext_local;
  RecyclableObject *instance_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  regexPrototype_00 = JavascriptLibraryBase::GetRegExpPrototype(&this->super_JavascriptLibraryBase);
  bVar1 = JavascriptRegExp::HasOriginalRegExType(instance);
  local_21 = true;
  if (bVar1) {
    bVar1 = JavascriptRegExp::HasObservableExec(regexPrototype_00);
    local_21 = true;
    if (!bVar1) {
      bVar1 = JavascriptRegExp::HasObservableGlobalFlag(regexPrototype_00);
      local_21 = true;
      if (!bVar1) {
        local_21 = JavascriptRegExp::HasObservableUnicodeFlag(regexPrototype_00);
      }
    }
  }
  return local_21;
}

Assistant:

bool RegexHelper::IsRegexSymbolMatchObservable(RecyclableObject* instance, ScriptContext* scriptContext)
    {
        DynamicObject* regexPrototype = scriptContext->GetLibrary()->GetRegExpPrototype();
        return !JavascriptRegExp::HasOriginalRegExType(instance)
            || JavascriptRegExp::HasObservableExec(regexPrototype)
            || JavascriptRegExp::HasObservableGlobalFlag(regexPrototype)
            || JavascriptRegExp::HasObservableUnicodeFlag(regexPrototype);
    }